

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_abs<unsigned_long>(uint length)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long *local_20;
  shared_ptr<unsigned_long> pv;
  
  iVar1 = posix_memalign(&local_20,0x40,(long)(int)length << 3);
  if (iVar1 != 0) {
    local_20 = (long *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,local_20,
             sse::common::free<unsigned_long>);
  if (0 < (int)length) {
    lVar3 = 0;
    plVar2 = local_20;
    do {
      *plVar2 = lVar3;
      lVar3 = lVar3 + -1;
      plVar2 = plVar2 + 1;
    } while (-lVar3 != (ulong)length);
  }
  if (pv.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}